

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

bool __thiscall AWeapon::Use(AWeapon *this,bool pickup)

{
  bool bVar1;
  AWeapon *pAVar2;
  AInventory *pAVar3;
  AActor *pAVar4;
  AWeapon *local_28;
  AWeapon *useweap;
  bool pickup_local;
  AWeapon *this_local;
  
  if ((*(uint *)&(this->super_AStateProvider).super_AInventory.field_0x4fc & 0x400) == 0) {
    bVar1 = TObjPtr<AWeapon>::operator!=(&this->SisterWeapon,(AWeapon *)0x0);
    local_28 = this;
    if ((bVar1) &&
       (pAVar2 = TObjPtr<AWeapon>::operator->(&this->SisterWeapon),
       (*(uint *)&(pAVar2->super_AStateProvider).super_AInventory.field_0x4fc & 0x400) != 0)) {
      pAVar4 = TObjPtr<AActor>::operator->(&(this->super_AStateProvider).super_AInventory.Owner);
      pAVar3 = AActor::FindInventory
                         (pAVar4,(PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
      if (pAVar3 != (AInventory *)0x0) {
        local_28 = ::TObjPtr::operator_cast_to_AWeapon_((TObjPtr *)&this->SisterWeapon);
      }
    }
    pAVar4 = TObjPtr<AActor>::operator->(&(this->super_AStateProvider).super_AInventory.Owner);
    if ((pAVar4->player != (player_t *)0x0) &&
       (pAVar4 = TObjPtr<AActor>::operator->(&(this->super_AStateProvider).super_AInventory.Owner),
       pAVar4->player->ReadyWeapon != local_28)) {
      pAVar4 = TObjPtr<AActor>::operator->(&(this->super_AStateProvider).super_AInventory.Owner);
      pAVar4->player->PendingWeapon = local_28;
    }
  }
  return false;
}

Assistant:

bool AWeapon::Use (bool pickup)
{
	AWeapon *useweap = this;

	// Powered up weapons cannot be used directly.
	if (WeaponFlags & WIF_POWERED_UP) return false;

	// If the player is powered-up, use the alternate version of the
	// weapon, if one exists.
	if (SisterWeapon != NULL &&
		SisterWeapon->WeaponFlags & WIF_POWERED_UP &&
		Owner->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true))
	{
		useweap = SisterWeapon;
	}
	if (Owner->player != NULL && Owner->player->ReadyWeapon != useweap)
	{
		Owner->player->PendingWeapon = useweap;
	}
	// Return false so that the weapon is not removed from the inventory.
	return false;
}